

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O0

QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::FourierMotzkinConf::Lhs> *
__thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::FastGeneralizationsIterator
::next(FastGeneralizationsIterator *this)

{
  TypedTermList t;
  bool bVar1;
  byte *in_RSI;
  SortId in_RDI;
  SmartPtr<Indexing::ResultSubstitution> *pSVar2;
  FastGeneralizationsIterator *in_stack_00000008;
  Lhs *ld;
  Renaming *in_stack_ffffffffffffff70;
  SmartPtr<Indexing::ResultSubstitution> *in_stack_ffffffffffffff78;
  Renaming *in_stack_ffffffffffffff80;
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::FourierMotzkinConf::Lhs>
  *this_00;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 uVar3;
  GenMatcher *this_01;
  SmartPtr<Indexing::ResultSubstitution> local_58 [2];
  undefined1 local_38 [32];
  Lhs *local_18;
  
  this_01 = (GenMatcher *)in_RDI._content;
  do {
    bVar1 = Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>::hasNext
                      ((VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*> *)0x3f236f);
    uVar3 = false;
    if (!bVar1) {
      uVar3 = findNextLeaf(in_stack_00000008);
    }
  } while ((bool)uVar3 != false);
  local_18 = Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>::next
                       ((VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*> *)0x3f23a4);
  if ((*in_RSI & 1) == 0) {
    pSVar2 = local_58;
    Lib::SmartPtr<Indexing::ResultSubstitution>::SmartPtr(pSVar2);
    QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::FourierMotzkinConf::Lhs>
    ::QueryRes((QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::FourierMotzkinConf::Lhs>
                *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(Lhs *)pSVar2);
    Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr(pSVar2);
  }
  else {
    pSVar2 = (SmartPtr<Indexing::ResultSubstitution> *)(in_RSI + 0x70);
    Kernel::Renaming::reset(in_stack_ffffffffffffff70);
    local_38._16_16_ =
         (undefined1  [16])
         Kernel::SelectedSummand::key((SelectedSummand *)in_stack_ffffffffffffff80);
    t.super_TermList._content._7_1_ = uVar3;
    t.super_TermList._content._0_7_ = in_stack_ffffffffffffff88;
    t._sort._content = in_RDI._content;
    Kernel::Renaming::normalizeVariables(in_stack_ffffffffffffff80,t);
    this_00 = (QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::FourierMotzkinConf::Lhs>
               *)local_38;
    SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::GenMatcher::getSubstitution
              (this_01,(Renaming *)in_RDI._content);
    QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::FourierMotzkinConf::Lhs>
    ::QueryRes(this_00,pSVar2,(Lhs *)in_stack_ffffffffffffff70);
    Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr
              ((SmartPtr<Indexing::ResultSubstitution> *)in_stack_ffffffffffffff70);
  }
  return (QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::FourierMotzkinConf::Lhs>
          *)this_01;
}

Assistant:

QueryRes<ResultSubstitutionSP, LeafData_> SubstitutionTree<LeafData_>::FastGeneralizationsIterator::next()
{
  while(!_ldIterator.hasNext() && findNextLeaf()) {}
  ASS(_ldIterator.hasNext());
  auto ld = _ldIterator.next();

  if(_retrieveSubstitution) {
    _resultNormalizer.reset();
    _resultNormalizer.normalizeVariables(ld->key());

    return QueryRes(_subst.getSubstitution(&_resultNormalizer),ld);
  } else {
    return QueryRes(ResultSubstitutionSP(), ld);
  }
}